

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::standard_reporter::print_outlier_count
          (standard_reporter *this,char *description,int count,int total)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  detail *this_00;
  string local_40;
  
  if (0 < count) {
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (&(this->super_reporter).os);
    poVar2 = std::operator<<(pbVar1,"  ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,count);
    this_00 = (detail *)0x17d4f9;
    poVar2 = std::operator<<(poVar2," (");
    detail::percentage_abi_cxx11_(&local_40,this_00,(double)count / (double)total);
    poVar2 = std::operator<<(poVar2,(string *)&local_40);
    poVar2 = std::operator<<(poVar2,") ");
    poVar2 = std::operator<<(poVar2,description);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void print_outlier_count(const char* description, int count, int total) {
            if(count > 0) report_stream() << "  " << count << " (" << detail::percentage_ratio(count, total) << ") " << description << "\n";
        }